

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_orthog(REF_INT n,REF_DBL *a)

{
  double local_38;
  double local_30;
  REF_DBL norm;
  uint local_20;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL *a_local;
  REF_INT n_local;
  
  k = 0;
  do {
    local_20 = k;
    if (n <= k) {
      return 0;
    }
    while (local_20 = local_20 + 1, (int)local_20 < n) {
      local_30 = 0.0;
      for (norm._4_4_ = 0; norm._4_4_ < n; norm._4_4_ = norm._4_4_ + 1) {
        local_30 = a[norm._4_4_ + n * k] * a[(int)(norm._4_4_ + n * local_20)] + local_30;
      }
      if (local_30 <= 0.0) {
        local_38 = -local_30;
      }
      else {
        local_38 = local_30;
      }
      if (1e-13 < local_38) {
        printf(" %d-%d not orthog: %e\n",local_30,(ulong)(uint)k,(ulong)local_20);
        printf(" %f %f %f\n",*a,a[3],a[6]);
        printf(" %f %f %f\n",a[1],a[4],a[7]);
        printf(" %f %f %f\n",a[2],a[5],a[8]);
        return 3;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_orthog(REF_INT n, REF_DBL *a) {
  REF_INT i, j, k;
  REF_DBL norm;

  for (i = 0; i < n; i++)
    for (j = i + 1; j < n; j++) {
      norm = 0.0;
      for (k = 0; k < n; k++) norm += a[k + n * i] * a[k + n * j];
      if (ABS(norm) > 1.0e-13) {
        printf(" %d-%d not orthog: %e\n", i, j, norm);
        printf(" %f %f %f\n", a[0], a[3], a[6]);
        printf(" %f %f %f\n", a[1], a[4], a[7]);
        printf(" %f %f %f\n", a[2], a[5], a[8]);
        return REF_INVALID;
      }
    }

  return REF_SUCCESS;
}